

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int exprMightBeIndexed(SrcList *pFrom,int op,Bitmask mPrereq,Expr *pExpr,int *piCur,int *piColumn)

{
  ushort uVar1;
  int iTab;
  ExprList *pEVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  Index *pIVar6;
  short *psVar7;
  
  if ((op - 0x26U < 4) && (pExpr->op == 0x9e)) {
    pExpr = ((pExpr->x).pList)->a->pExpr;
  }
  if (pExpr->op == 0x98) {
    *piCur = pExpr->iTable;
    iVar4 = (int)pExpr->iColumn;
LAB_00169d96:
    *piColumn = iVar4;
    iVar4 = 1;
  }
  else {
    iVar4 = 0;
    if (mPrereq - 1 < (mPrereq ^ mPrereq - 1)) {
      iVar4 = 0;
      lVar5 = 0;
      if (1 < mPrereq) {
        do {
          lVar5 = lVar5 + 1;
          bVar3 = 3 < mPrereq;
          mPrereq = mPrereq >> 1;
        } while (bVar3);
      }
      pIVar6 = (pFrom->a[lVar5].pTab)->pIndex;
      if (pIVar6 != (Index *)0x0) {
        iTab = pFrom->a[lVar5].iCursor;
        do {
          pEVar2 = pIVar6->aColExpr;
          if ((pEVar2 != (ExprList *)0x0) && (uVar1 = pIVar6->nKeyCol, uVar1 != 0)) {
            psVar7 = pIVar6->aiColumn;
            lVar5 = 0;
            do {
              if ((*psVar7 == -2) &&
                 (iVar4 = sqlite3ExprCompare(pExpr,*(Expr **)((long)&pEVar2->a->pExpr + lVar5),iTab)
                 , iVar4 == 0)) {
                *piCur = iTab;
                iVar4 = -2;
                goto LAB_00169d96;
              }
              lVar5 = lVar5 + 0x20;
              psVar7 = psVar7 + 1;
            } while ((ulong)uVar1 * 0x20 != lVar5);
          }
          pIVar6 = pIVar6->pNext;
          iVar4 = 0;
        } while (pIVar6 != (Index *)0x0);
      }
    }
  }
  return iVar4;
}

Assistant:

static int exprMightBeIndexed(
  SrcList *pFrom,        /* The FROM clause */
  int op,                /* The specific comparison operator */
  Bitmask mPrereq,       /* Bitmask of FROM clause terms referenced by pExpr */
  Expr *pExpr,           /* An operand of a comparison operator */
  int *piCur,            /* Write the referenced table cursor number here */
  int *piColumn          /* Write the referenced table column number here */
){
  Index *pIdx;
  int i;
  int iCur;

  /* If this expression is a vector to the left or right of a 
  ** inequality constraint (>, <, >= or <=), perform the processing 
  ** on the first element of the vector.  */
  assert( TK_GT+1==TK_LE && TK_GT+2==TK_LT && TK_GT+3==TK_GE );
  assert( TK_IS<TK_GE && TK_ISNULL<TK_GE && TK_IN<TK_GE );
  assert( op<=TK_GE );
  if( pExpr->op==TK_VECTOR && (op>=TK_GT && ALWAYS(op<=TK_GE)) ){
    pExpr = pExpr->x.pList->a[0].pExpr;
  }

  if( pExpr->op==TK_COLUMN ){
    *piCur = pExpr->iTable;
    *piColumn = pExpr->iColumn;
    return 1;
  }
  if( mPrereq==0 ) return 0;                 /* No table references */
  if( (mPrereq&(mPrereq-1))!=0 ) return 0;   /* Refs more than one table */
  for(i=0; mPrereq>1; i++, mPrereq>>=1){}
  iCur = pFrom->a[i].iCursor;
  for(pIdx=pFrom->a[i].pTab->pIndex; pIdx; pIdx=pIdx->pNext){
    if( pIdx->aColExpr==0 ) continue;
    for(i=0; i<pIdx->nKeyCol; i++){
      if( pIdx->aiColumn[i]!=XN_EXPR ) continue;
      if( sqlite3ExprCompare(pExpr, pIdx->aColExpr->a[i].pExpr, iCur)==0 ){
        *piCur = iCur;
        *piColumn = XN_EXPR;
        return 1;
      }
    }
  }
  return 0;
}